

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O2

void __thiscall duckdb::ReservoirSample::NormalizeWeights(ReservoirSample *this)

{
  pointer ppVar1;
  long lVar2;
  pointer ppVar3;
  pointer pBVar4;
  ulong uVar5;
  reference __args;
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  *this_00;
  __normal_iterator<std::pair<double,_unsigned_long>_*,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>_>
  __i;
  long lVar6;
  pointer ppVar7;
  value_type top;
  vector<std::pair<double,_unsigned_long>,_true> tmp_weights;
  pair<double,_unsigned_long> local_48;
  _Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &(this->super_BlockingSample).base_reservoir_sample;
  while( true ) {
    pBVar4 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    ppVar3 = local_38._M_impl.super__Vector_impl_data._M_finish;
    ppVar1 = local_38._M_impl.super__Vector_impl_data._M_start;
    if ((pBVar4->reservoir_weights).c.
        super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pBVar4->reservoir_weights).c.
        super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    pBVar4 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    ppVar1 = (pBVar4->reservoir_weights).c.
             super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_48.first = ppVar1->first;
    local_48.second = ppVar1->second;
    ::std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>::
    emplace_back<std::pair<double,unsigned_long>>
              ((vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>
                *)&local_38,&local_48);
    pBVar4 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    ::std::
    priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
    ::pop(&pBVar4->reservoir_weights);
  }
  if (local_38._M_impl.super__Vector_impl_data._M_start !=
      local_38._M_impl.super__Vector_impl_data._M_finish) {
    lVar6 = (long)local_38._M_impl.super__Vector_impl_data._M_finish -
            (long)local_38._M_impl.super__Vector_impl_data._M_start;
    uVar5 = lVar6 >> 4;
    lVar2 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_long>*,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::ReservoirSample::NormalizeWeights()::__0>>
              (local_38._M_impl.super__Vector_impl_data._M_start,
               local_38._M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar6 < 0x101) {
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_long>*,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::ReservoirSample::NormalizeWeights()::__0>>
                (ppVar1,ppVar3);
    }
    else {
      ppVar7 = ppVar1 + 0x10;
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_long>*,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::ReservoirSample::NormalizeWeights()::__0>>
                (ppVar1,ppVar7);
      for (; ppVar7 != ppVar3; ppVar7 = ppVar7 + 1) {
        ::std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_long>*,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>>,__gnu_cxx::__ops::_Val_comp_iter<duckdb::ReservoirSample::NormalizeWeights()::__0>>
                  (ppVar7);
      }
    }
  }
  for (local_48.first = 0.0;
      (ulong)local_48.first <
      (ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38._M_impl.super__Vector_impl_data._M_start >> 4);
      local_48.first = (double)((long)local_48.first + 1)) {
    pBVar4 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    __args = ::std::
             vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
             ::at((vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                   *)&local_38,(size_type)local_48.first);
    ::std::
    priority_queue<std::pair<double,unsigned_long>,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>,std::less<std::pair<double,unsigned_long>>>
    ::emplace<double&,unsigned_long&>
              ((priority_queue<std::pair<double,unsigned_long>,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>,std::less<std::pair<double,unsigned_long>>>
                *)&pBVar4->reservoir_weights,&__args->first,(unsigned_long *)&local_48);
  }
  pBVar4 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_00);
  BaseReservoirSampling::SetNextEntry(pBVar4);
  ::std::
  _Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  ::~_Vector_base(&local_38);
  return;
}

Assistant:

void ReservoirSample::NormalizeWeights() {
	vector<std::pair<double, idx_t>> tmp_weights;
	while (!base_reservoir_sample->reservoir_weights.empty()) {
		auto top = base_reservoir_sample->reservoir_weights.top();
		tmp_weights.push_back(std::move(top));
		base_reservoir_sample->reservoir_weights.pop();
	}
	std::sort(tmp_weights.begin(), tmp_weights.end(),
	          [&](std::pair<double, idx_t> a, std::pair<double, idx_t> b) { return a.second < b.second; });
	for (idx_t i = 0; i < tmp_weights.size(); i++) {
		base_reservoir_sample->reservoir_weights.emplace(tmp_weights.at(i).first, i);
	}
	base_reservoir_sample->SetNextEntry();
}